

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void __thiscall ON_BrepEdge::ON_BrepEdge(ON_BrepEdge *this)

{
  ON_BrepEdge *this_local;
  
  ON_CurveProxy::ON_CurveProxy(&this->super_ON_CurveProxy,(ON_Curve *)0x0);
  (this->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b6b588;
  this->m_status = ON_ComponentStatus::NoneSet;
  this->m_reserved1 = 0;
  this->m_edge_index = -1;
  this->m_c3i = -1;
  ON_SimpleArray<int>::ON_SimpleArray(&this->m_ti);
  this->m_tolerance = -1.23432101234321e+308;
  this->m_brep = (ON_Brep *)0x0;
  memset(&this->m_edge_user,0,8);
  this->m_vi[1] = -1;
  this->m_vi[0] = -1;
  return;
}

Assistant:

ON_BrepEdge::ON_BrepEdge() 
  : ON_CurveProxy(0)
{
  memset(&m_edge_user,0,sizeof(m_edge_user));
  m_vi[0] = m_vi[1] = -1;
}